

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsInfo.cpp
# Opt level: O2

InfoStatus
getInfoIndex(HighsLogOptions *report_log_options,string *name,
            vector<InfoRecord_*,_std::allocator<InfoRecord_*>_> *info_records,HighsInt *index)

{
  pointer ppIVar1;
  pointer ppIVar2;
  __type _Var3;
  int iVar4;
  
  ppIVar1 = (info_records->super__Vector_base<InfoRecord_*,_std::allocator<InfoRecord_*>_>)._M_impl.
            super__Vector_impl_data._M_finish;
  ppIVar2 = (info_records->super__Vector_base<InfoRecord_*,_std::allocator<InfoRecord_*>_>)._M_impl.
            super__Vector_impl_data._M_start;
  iVar4 = 0;
  while( true ) {
    *index = iVar4;
    if ((int)((ulong)((long)ppIVar1 - (long)ppIVar2) >> 3) <= iVar4) {
      highsLogUser(report_log_options,kError,"getInfoIndex: Info \"%s\" is unknown\n",
                   (name->_M_dataplus)._M_p);
      return kUnknownInfo;
    }
    _Var3 = std::operator==(&(info_records->
                             super__Vector_base<InfoRecord_*,_std::allocator<InfoRecord_*>_>).
                             _M_impl.super__Vector_impl_data._M_start[iVar4]->name,name);
    if (_Var3) break;
    iVar4 = *index + 1;
  }
  return kOk;
}

Assistant:

InfoStatus getInfoIndex(const HighsLogOptions& report_log_options,
                        const std::string& name,
                        const std::vector<InfoRecord*>& info_records,
                        HighsInt& index) {
  HighsInt num_info = info_records.size();
  for (index = 0; index < num_info; index++)
    if (info_records[index]->name == name) return InfoStatus::kOk;
  highsLogUser(report_log_options, HighsLogType::kError,
               "getInfoIndex: Info \"%s\" is unknown\n", name.c_str());
  return InfoStatus::kUnknownInfo;
}